

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O2

void __thiscall fast_float::bigint::bigint(bigint *this,uint64_t value)

{
  memset((this->vec).data + 1,0,0x1f0);
  (this->vec).data[0] = value;
  (this->vec).length = 1;
  stackvec<(unsigned_short)62>::normalize(&this->vec);
  return;
}

Assistant:

FASTFLOAT_CONSTEXPR20 bigint(uint64_t value): vec() {
#ifdef FASTFLOAT_64BIT_LIMB
    vec.push_unchecked(value);
#else
    vec.push_unchecked(uint32_t(value));
    vec.push_unchecked(uint32_t(value >> 32));
#endif
    vec.normalize();
  }